

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O1

bool __thiscall
glslang::HlslGrammar::acceptConditionalExpression(HlslGrammar *this,TIntermTyped **node)

{
  int *piVar1;
  HlslToken *loc_00;
  bool bVar2;
  TIntermTyped *pTVar3;
  char *pcVar4;
  HlslParseContext *pHVar5;
  _func_int **pp_Var6;
  TIntermTyped *falseNode;
  TIntermTyped *trueNode;
  TSourceLoc loc;
  TIntermTyped *local_48;
  TIntermTyped *local_40;
  TSourceLoc local_38;
  
  bVar2 = acceptBinaryExpression(this,node,PlLogicalOr);
  if (!bVar2) {
    return false;
  }
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokQuestion);
  if (!bVar2) {
    return true;
  }
  loc_00 = &(this->super_HlslTokenStream).token;
  pTVar3 = HlslParseContext::convertConditionalExpression
                     (this->parseContext,&loc_00->loc,*node,false);
  *node = pTVar3;
  if (pTVar3 == (TIntermTyped *)0x0) {
    return false;
  }
  piVar1 = &(this->parseContext->super_TParseContextBase).controlFlowNestingLevel;
  *piVar1 = *piVar1 + 1;
  local_40 = (TIntermTyped *)0x0;
  bVar2 = acceptExpression(this,&local_40);
  if (bVar2) {
    local_38.column = (this->super_HlslTokenStream).token.loc.column;
    local_38._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    local_38.name = (loc_00->loc).name;
    local_38.string = (this->super_HlslTokenStream).token.loc.string;
    local_38.line = (this->super_HlslTokenStream).token.loc.line;
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokColon);
    if (bVar2) {
      local_48 = (TIntermTyped *)0x0;
      bVar2 = acceptAssignmentExpression(this,&local_48);
      pHVar5 = this->parseContext;
      if (bVar2) {
        piVar1 = &(pHVar5->super_TParseContextBase).controlFlowNestingLevel;
        *piVar1 = *piVar1 + -1;
        pTVar3 = TIntermediate::addSelection(this->intermediate,*node,local_40,local_48,&local_38);
        *node = pTVar3;
        return bVar2;
      }
      pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
      pcVar4 = "expression after :";
      goto LAB_003a53fd;
    }
    pHVar5 = this->parseContext;
    pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar4 = ":";
  }
  else {
    pHVar5 = this->parseContext;
    pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar4 = "expression after ?";
  }
  bVar2 = false;
LAB_003a53fd:
  (*pp_Var6[0x2d])(pHVar5,loc_00,"Expected",pcVar4,"");
  return bVar2;
}

Assistant:

bool HlslGrammar::acceptConditionalExpression(TIntermTyped*& node)
{
    // binary_expression
    if (! acceptBinaryExpression(node, PlLogicalOr))
        return false;

    if (! acceptTokenClass(EHTokQuestion))
        return true;

    node = parseContext.convertConditionalExpression(token.loc, node, false);
    if (node == nullptr)
        return false;

    ++parseContext.controlFlowNestingLevel;  // this only needs to work right if no errors

    TIntermTyped* trueNode = nullptr;
    if (! acceptExpression(trueNode)) {
        expected("expression after ?");
        return false;
    }
    TSourceLoc loc = token.loc;

    if (! acceptTokenClass(EHTokColon)) {
        expected(":");
        return false;
    }

    TIntermTyped* falseNode = nullptr;
    if (! acceptAssignmentExpression(falseNode)) {
        expected("expression after :");
        return false;
    }

    --parseContext.controlFlowNestingLevel;

    node = intermediate.addSelection(node, trueNode, falseNode, loc);

    return true;
}